

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_printf_internal(JSContext *ctx,int argc,JSValue *argv,FILE *fp)

{
  byte bVar1;
  int64_t iVar2;
  int iVar3;
  int iVar4;
  byte *ptr;
  uint8_t *p_00;
  char *ptr_00;
  size_t sVar5;
  byte bVar6;
  size_t len;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  JSValue val1;
  JSValue val1_00;
  JSValue JVar12;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  int32_t int32_arg;
  int local_d0;
  int local_cc;
  FILE *local_c8;
  JSValue *local_c0;
  char fmtbuf [32];
  int64_t int64_arg;
  DynBuf dbuf;
  double double_arg;
  size_t fmt_len;
  uint8_t *p;
  uint8_t cbuf [7];
  
  js_std_dbuf_init(ctx,&dbuf);
  if (0 < argc) {
    ptr = (byte *)JS_ToCStringLen(ctx,&fmt_len,*argv);
    if (ptr != (byte *)0x0) {
      pbVar9 = ptr;
      local_d0 = argc;
      local_c0 = argv;
      iVar4 = 1;
LAB_0010e09e:
      if (ptr + fmt_len <= pbVar9) goto LAB_0010e579;
      len = 0;
      while( true ) {
        pbVar8 = pbVar9 + len;
        p = pbVar9;
        if (ptr + fmt_len <= pbVar8) {
          dbuf_put(&dbuf,pbVar9,len);
          goto LAB_0010e579;
        }
        if (*pbVar8 == 0x25) break;
        len = len + 1;
      }
      local_cc = iVar4;
      local_c8 = (FILE *)fp;
      dbuf_put(&dbuf,pbVar9,len);
      iVar4 = local_cc;
      fmtbuf[0] = pbVar9[len];
      lVar10 = 0;
      while( true ) {
        uVar7 = (ulong)pbVar8[lVar10 + 1];
        if (0x30 < uVar7) break;
        if ((0x1288900000000U >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 0x2a) {
            if (local_d0 <= local_cc) goto LAB_0010e5ea;
            val.tag = local_c0[local_cc].tag;
            val.u.ptr = local_c0[local_cc].u.ptr;
            iVar3 = JS_ToInt32(ctx,&int32_arg,val);
            if (iVar3 != 0) goto LAB_0010e603;
            local_cc = iVar4 + 1;
            iVar4 = snprintf(fmtbuf + lVar10 + 1,0x1f - lVar10,"%d",(ulong)(uint)int32_arg);
            pbVar8 = pbVar8 + lVar10 + 2;
            lVar11 = lVar10 + iVar4 + 1;
            uVar7 = (ulong)*pbVar8;
            goto LAB_0010e19a;
          }
          break;
        }
        if (lVar10 == 0x1e) goto switchD_0010e2e6_caseD_62;
        fmtbuf[lVar10 + 1] = pbVar8[lVar10 + 1];
        lVar10 = lVar10 + 1;
      }
      pbVar9 = pbVar8 + lVar10;
      while( true ) {
        lVar11 = lVar10 + 1;
        pbVar8 = pbVar9 + 1;
        if ((int)uVar7 - 0x3aU < 0xfffffff6) break;
        if (lVar11 == 0x1f) goto switchD_0010e2e6_caseD_62;
        fmtbuf[lVar10 + 1] = (char)uVar7;
        uVar7 = (ulong)pbVar9[2];
        pbVar9 = pbVar8;
        lVar10 = lVar11;
      }
LAB_0010e19a:
      iVar4 = local_cc;
      bVar6 = (byte)uVar7;
      if (bVar6 != 0x2e) goto LAB_0010e29c;
      if (0x1e < lVar11) goto switchD_0010e2e6_caseD_62;
      lVar10 = lVar11 + 1;
      fmtbuf[lVar11] = '.';
      bVar6 = pbVar8[1];
      pbVar9 = pbVar8;
      if (bVar6 == 0x2a) {
        if (local_d0 <= local_cc) goto LAB_0010e5ea;
        val_00.tag = local_c0[local_cc].tag;
        val_00.u.ptr = local_c0[local_cc].u.ptr;
        iVar3 = JS_ToInt32(ctx,&int32_arg,val_00);
        if (iVar3 == 0) {
          iVar3 = snprintf(fmtbuf + lVar11 + 1,0x1f - lVar11,"%d",(ulong)(uint)int32_arg);
          bVar6 = pbVar8[2];
          pbVar8 = pbVar8 + 2;
          lVar11 = lVar10 + iVar3;
          iVar4 = iVar4 + 1;
          goto LAB_0010e29c;
        }
        goto LAB_0010e603;
      }
      while (pbVar8 = pbVar9 + 1, lVar11 = lVar10, 0xfffffff5 < bVar6 - 0x3a) {
        if (lVar10 == 0x1f) goto switchD_0010e2e6_caseD_62;
        fmtbuf[lVar10] = bVar6;
        lVar10 = lVar10 + 1;
        bVar6 = pbVar9[2];
        pbVar9 = pbVar8;
      }
LAB_0010e29c:
      if (0x1e < lVar11) goto switchD_0010e2e6_caseD_62;
      pbVar9 = pbVar8 + (ulong)(bVar6 == 0x6c) + 1;
      bVar1 = pbVar8[bVar6 == 0x6c];
      fmtbuf[lVar11] = bVar1;
      fmtbuf[lVar11 + 1] = '\0';
      switch(bVar1) {
      case 0x61:
      case 0x65:
      case 0x66:
      case 0x67:
switchD_0010e2e6_caseD_61:
        if (local_d0 <= iVar4) goto LAB_0010e5ea;
        val_02.tag = local_c0[iVar4].tag;
        val_02.u.ptr = local_c0[iVar4].u.ptr;
        iVar3 = JS_ToFloat64(ctx,&double_arg,val_02);
        if (iVar3 != 0) break;
        iVar4 = iVar4 + 1;
        dbuf_printf(&dbuf,fmtbuf,double_arg);
        fp = (FILE *)local_c8;
        goto LAB_0010e09e;
      case 99:
        if (local_d0 <= iVar4) goto LAB_0010e5ea;
        iVar2 = local_c0[iVar4].tag;
        if ((int)iVar2 == -7) {
          val1.tag = iVar2;
          val1.u.ptr = local_c0[iVar4].u.ptr;
          p_00 = (uint8_t *)JS_ToCString(ctx,val1);
          if (p_00 == (uint8_t *)0x0) break;
          int32_arg = unicode_from_utf8(p_00,6,&p);
          JS_FreeCString(ctx,(char *)p_00);
LAB_0010e516:
          if (0x10ffff < (uint)int32_arg) {
            int32_arg = 0xfffd;
          }
          local_cc = iVar4 + 1;
          iVar4 = unicode_to_utf8(cbuf,int32_arg);
          dbuf_put(&dbuf,cbuf,(long)iVar4);
          fp = (FILE *)local_c8;
          iVar4 = local_cc;
          goto LAB_0010e09e;
        }
        val_03.tag = iVar2;
        val_03.u.ptr = local_c0[iVar4].u.ptr;
        iVar3 = JS_ToInt32(ctx,&int32_arg,val_03);
        if (iVar3 == 0) goto LAB_0010e516;
        break;
      case 100:
      case 0x69:
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_0010e2e6_caseD_64:
        if (local_d0 <= iVar4) goto LAB_0010e5ea;
        val_01.tag = local_c0[iVar4].tag;
        val_01.u.ptr = local_c0[iVar4].u.ptr;
        iVar3 = JS_ToInt64Ext(ctx,&int64_arg,val_01);
        if (iVar3 != 0) goto LAB_0010e603;
        iVar4 = iVar4 + 1;
        if (bVar6 != 0x6c) {
          dbuf_printf(&dbuf,fmtbuf,(ulong)(uint)int64_arg);
          fp = (FILE *)local_c8;
          goto LAB_0010e09e;
        }
        if (lVar11 < 0x1d) {
          fmtbuf[lVar11 + 2] = fmtbuf[lVar11];
          (fmtbuf + lVar11)[0] = 'l';
          (fmtbuf + lVar11)[1] = 'l';
          fmtbuf[lVar11 + 3] = '\0';
          dbuf_printf(&dbuf,fmtbuf,CONCAT44(int64_arg._4_4_,(uint)int64_arg));
          fp = (FILE *)local_c8;
          goto LAB_0010e09e;
        }
      case 0x62:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
switchD_0010e2e6_caseD_62:
        JS_ThrowTypeError(ctx,"invalid conversion specifier in format string");
        break;
      case 0x73:
        if (local_d0 <= iVar4) {
LAB_0010e5ea:
          JS_ThrowReferenceError(ctx,"missing argument for conversion specifier");
          break;
        }
        val1_00.tag = local_c0[iVar4].tag;
        val1_00.u.ptr = local_c0[iVar4].u.ptr;
        ptr_00 = JS_ToCString(ctx,val1_00);
        if (ptr_00 == (char *)0x0) break;
        iVar4 = iVar4 + 1;
        dbuf_printf(&dbuf,fmtbuf,ptr_00);
        JS_FreeCString(ctx,ptr_00);
        fp = (FILE *)local_c8;
        goto LAB_0010e09e;
      default:
        if (bVar1 - 0x45 < 3) goto switchD_0010e2e6_caseD_61;
        if (bVar1 != 0x25) {
          if (bVar1 != 0x41) {
            if (bVar1 == 0x58) goto switchD_0010e2e6_caseD_64;
            goto switchD_0010e2e6_caseD_62;
          }
          goto switchD_0010e2e6_caseD_61;
        }
        dbuf_putc(&dbuf,'%');
        fp = (FILE *)local_c8;
        goto LAB_0010e09e;
      }
      JVar12 = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_0010e606;
    }
LAB_0010e603:
    JVar12 = (JSValue)(ZEXT816(6) << 0x40);
    goto LAB_0010e606;
  }
  goto LAB_0010e589;
LAB_0010e579:
  JS_FreeCString(ctx,(char *)ptr);
LAB_0010e589:
  if (dbuf.error == 0) {
    if ((FILE *)fp == (FILE *)0x0) {
      JVar12 = JS_NewStringLen(ctx,(char *)dbuf.buf,dbuf.size);
    }
    else {
      sVar5 = fwrite(dbuf.buf,1,dbuf.size,(FILE *)fp);
      JVar12.tag = 0;
      JVar12.u.ptr = (void *)(sVar5 & 0xffffffff);
    }
  }
  else {
    JVar12 = JS_ThrowOutOfMemory(ctx);
  }
LAB_0010e606:
  dbuf_free(&dbuf);
  return JVar12;
}

Assistant:

static JSValue js_printf_internal(JSContext *ctx,
                                  int argc, JSValueConst *argv, FILE *fp)
{
    char fmtbuf[32];
    uint8_t cbuf[UTF8_CHAR_LEN_MAX+1];
    JSValue res;
    DynBuf dbuf;
    const char *fmt_str;
    const uint8_t *fmt, *fmt_end;
    const uint8_t *p;
    char *q;
    int i, c, len, mod;
    size_t fmt_len;
    int32_t int32_arg;
    int64_t int64_arg;
    double double_arg;
    const char *string_arg;
    /* Use indirect call to dbuf_printf to prevent gcc warning */
    int (*dbuf_printf_fun)(DynBuf *s, const char *fmt, ...) = (void*)dbuf_printf;

    js_std_dbuf_init(ctx, &dbuf);

    if (argc > 0) {
        fmt_str = JS_ToCStringLen(ctx, &fmt_len, argv[0]);
        if (!fmt_str)
            goto fail;

        i = 1;
        fmt = (const uint8_t *)fmt_str;
        fmt_end = fmt + fmt_len;
        while (fmt < fmt_end) {
            for (p = fmt; fmt < fmt_end && *fmt != '%'; fmt++)
                continue;
            dbuf_put(&dbuf, p, fmt - p);
            if (fmt >= fmt_end)
                break;
            q = fmtbuf;
            *q++ = *fmt++;  /* copy '%' */
            
            /* flags */
            for(;;) {
                c = *fmt;
                if (c == '0' || c == '#' || c == '+' || c == '-' || c == ' ' ||
                    c == '\'') {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = c;
                    fmt++;
                } else {
                    break;
                }
            }
            /* width */
            if (*fmt == '*') {
                if (i >= argc)
                    goto missing;
                if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                    goto fail;
                q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                fmt++;
            } else {
                while (my_isdigit(*fmt)) {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = *fmt++;
                }
            }
            if (*fmt == '.') {
                if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                    goto invalid;
                *q++ = *fmt++;
                if (*fmt == '*') {
                    if (i >= argc)
                        goto missing;
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                    q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                    fmt++;
                } else {
                    while (my_isdigit(*fmt)) {
                        if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                            goto invalid;
                        *q++ = *fmt++;
                    }
                }
            }

            /* we only support the "l" modifier for 64 bit numbers */
            mod = ' ';
            if (*fmt == 'l') {
                mod = *fmt++;
            }
            
            /* type */
            c = *fmt++;
            if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                goto invalid;
            *q++ = c;
            *q = '\0';
            
            switch (c) {
            case 'c':
                if (i >= argc)
                    goto missing;
                if (JS_IsString(argv[i])) {
                    string_arg = JS_ToCString(ctx, argv[i++]);
                    if (!string_arg)
                        goto fail;
                    int32_arg = unicode_from_utf8((uint8_t *)string_arg, UTF8_CHAR_LEN_MAX, &p);
                    JS_FreeCString(ctx, string_arg);
                } else {
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                }
                /* handle utf-8 encoding explicitly */
                if ((unsigned)int32_arg > 0x10FFFF)
                    int32_arg = 0xFFFD;
                /* ignore conversion flags, width and precision */
                len = unicode_to_utf8(cbuf, int32_arg);
                dbuf_put(&dbuf, cbuf, len);
                break;
                
            case 'd':
            case 'i':
            case 'o':
            case 'u':
            case 'x':
            case 'X':
                if (i >= argc)
                    goto missing;
                if (JS_ToInt64Ext(ctx, &int64_arg, argv[i++]))
                    goto fail;
                if (mod == 'l') {
                    /* 64 bit number */
#if defined(_WIN32)
                    if (q >= fmtbuf + sizeof(fmtbuf) - 3)
                        goto invalid;
                    q[2] = q[-1];
                    q[-1] = 'I';
                    q[0] = '6';
                    q[1] = '4';
                    q[3] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (int64_t)int64_arg);
#else
                    if (q >= fmtbuf + sizeof(fmtbuf) - 2)
                        goto invalid;
                    q[1] = q[-1];
                    q[-1] = q[0] = 'l';
                    q[2] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (long long)int64_arg);
#endif
                } else {
                    dbuf_printf_fun(&dbuf, fmtbuf, (int)int64_arg);
                }
                break;

            case 's':
                if (i >= argc)
                    goto missing;
                /* XXX: handle strings containing null characters */
                string_arg = JS_ToCString(ctx, argv[i++]);
                if (!string_arg)
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, string_arg);
                JS_FreeCString(ctx, string_arg);
                break;
                
            case 'e':
            case 'f':
            case 'g':
            case 'a':
            case 'E':
            case 'F':
            case 'G':
            case 'A':
                if (i >= argc)
                    goto missing;
                if (JS_ToFloat64(ctx, &double_arg, argv[i++]))
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, double_arg);
                break;
                
            case '%':
                dbuf_putc(&dbuf, '%');
                break;
                
            default:
                /* XXX: should support an extension mechanism */
            invalid:
                JS_ThrowTypeError(ctx, "invalid conversion specifier in format string");
                goto fail;
            missing:
                JS_ThrowReferenceError(ctx, "missing argument for conversion specifier");
                goto fail;
            }
        }
        JS_FreeCString(ctx, fmt_str);
    }
    if (dbuf.error) {
        res = JS_ThrowOutOfMemory(ctx);
    } else {
        if (fp) {
            len = fwrite(dbuf.buf, 1, dbuf.size, fp);
            res = JS_NewInt32(ctx, len);
        } else {
            res = JS_NewStringLen(ctx, (char *)dbuf.buf, dbuf.size);
        }
    }
    dbuf_free(&dbuf);
    return res;

fail:
    dbuf_free(&dbuf);
    return JS_EXCEPTION;
}